

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node_struct *n,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  uint uVar3;
  undefined1 uVar4;
  uint uVar5;
  long lVar6;
  xpath_allocator *in_R8;
  xpath_node local_38;
  xml_node local_28;
  
  if (alloc == (xpath_allocator *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x276a,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  uVar5 = (uint)this & 0xff;
  if (7 < uVar5 - 1) {
    __assert_fail("false && \"Unknown axis\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x27ad,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_node_struct *, xpath_allocator *)"
                 );
  }
  uVar3 = *(uint *)&alloc->_root & 0xf;
  switch(uVar5) {
  case 1:
    if (uVar3 != 2) {
      return false;
    }
    goto LAB_001a1c40;
  case 3:
    if (uVar3 != 5) {
      return false;
    }
    break;
  case 4:
    if (uVar3 != 6) {
      return false;
    }
    break;
  case 5:
    if (1 < uVar3 - 3) {
      return false;
    }
    break;
  case 6:
    if (uVar3 != 6) {
      return false;
    }
LAB_001a1c40:
    if (((char_t *)alloc->_root_size == (char_t *)0x0) ||
       (bVar2 = strequal((char_t *)alloc->_root_size,(char_t *)ns), !bVar2)) {
      return false;
    }
    break;
  case 7:
    if (uVar3 != 2) {
      return false;
    }
    break;
  case 8:
    if (uVar3 != 2) {
      return false;
    }
    if (alloc->_root_size == 0) {
      return false;
    }
    uVar4 = (undefined1)ns->_type;
    if (uVar4 != type_unsorted) {
      lVar6 = 0;
      do {
        if (*(char *)(alloc->_root_size + lVar6) != uVar4) {
          return false;
        }
        uVar4 = *(char *)((long)&ns->_type + lVar6 + 1);
        lVar6 = lVar6 + 1;
      } while (uVar4 != type_unsorted);
    }
  }
  xml_node::xml_node(&local_28,(xml_node_struct *)alloc);
  xpath_node::xpath_node(&local_38,&local_28);
  pxVar1 = (xml_node_struct *)n->value;
  if (pxVar1 == n->parent) {
    xpath_node_set_raw::push_back_grow((xpath_node_set_raw *)n,&local_38,in_R8);
  }
  else {
    n->value = (char_t *)&pxVar1->value;
    pxVar1->header = (uintptr_t)local_38._node._root;
    pxVar1->name = (char_t *)local_38._attribute._attr;
  }
  return true;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc)
		{
			assert(n);

			xml_node_type type = PUGI_IMPL_NODETYPE(n);

			switch (_test)
			{
			case nodetest_name:
				if (type == node_element && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
				ns.push_back(xml_node(n), alloc);
				return true;

			case nodetest_type_comment:
				if (type == node_comment)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_text:
				if (type == node_pcdata || type == node_cdata)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_type_pi:
				if (type == node_pi)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_pi:
				if (type == node_pi && n->name && strequal(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all:
				if (type == node_element)
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (type == node_element && n->name && starts_with(n->name, _data.nodetest))
				{
					ns.push_back(xml_node(n), alloc);
					return true;
				}
				break;

			default:
				assert(false && "Unknown axis"); // unreachable
			}

			return false;
		}